

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

void get_spell_info(wchar_t spell_index,char *p,size_t len)

{
  uint16_t uVar1;
  effect *effect;
  int iVar2;
  wchar_t *pwVar3;
  int iVar4;
  wchar_t *pwVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  wchar_t rad;
  ulong uVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  char *pcVar14;
  long lVar15;
  random_value_conflict rv;
  spell_info_iteration_state ist;
  random_value local_c8;
  char local_b8 [40];
  char *local_90;
  effect *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  random_value local_58;
  random_value local_48;
  long local_38;
  
  pwVar3 = &((player->class->magic).books)->num_spells;
  wVar13 = L'\0';
  do {
    wVar12 = wVar13;
    pwVar5 = pwVar3;
    wVar13 = *pwVar5 + wVar12;
    pwVar3 = pwVar5 + 8;
  } while (wVar13 <= spell_index);
  effect = (*(class_spell **)(pwVar5 + 3))[spell_index - wVar12].effect;
  local_48.base = 0;
  local_48.dice = 0;
  local_48.sides = 0;
  local_48.m_bonus = 0;
  local_58.base = 0;
  local_58.dice = 0;
  local_58.sides = 0;
  local_58.m_bonus = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = (effect *)0x0;
  uStack_80 = 0;
  local_38 = 0;
  *p = '\0';
  local_90 = p;
  do {
    if (effect == (effect *)0x0) {
      return;
    }
    local_c8.base = 0;
    local_c8.dice = 0;
    local_c8.sides = 0;
    local_c8.m_bonus = 0;
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    sVar6 = strlen(p);
    if (effect->index == 0x6d) {
      if (effect->dice != (dice_t *)0x0) {
        local_38 = CONCAT71(local_38._1_7_,1);
        dice_roll(effect->dice,&local_48);
      }
    }
    else if (effect->index == 0x6e) {
      local_38 = (ulong)local_38._1_7_ << 8;
    }
    pcVar7 = effect_info(effect);
    if (pcVar7 == (char *)0x0) goto LAB_001a902a;
    if (effect->dice == (dice_t *)0x0) {
      if ((char)local_38 == '\x01') {
        local_c8.base = local_48.base;
        local_c8.dice = local_48.dice;
        local_c8.sides = local_48.sides;
        local_c8.m_bonus = local_48.m_bonus;
      }
    }
    else {
      dice_roll(effect->dice,&local_c8);
    }
    uVar1 = effect->index;
    switch(uVar1) {
    case 0x46:
      wVar13 = effect->radius;
      if (wVar13 != L'\0') {
LAB_001a8e07:
        uVar11 = (ulong)(uint)wVar13;
        pcVar14 = ", rad %d";
        goto LAB_001a8e0e;
      }
      pcVar14 = ", rad 2";
      goto LAB_001a8e42;
    case 0x47:
      wVar13 = effect->radius;
      if (wVar13 != L'\0') {
        if (effect->other != L'\0') {
          wVar13 = wVar13 + (int)player->lev / effect->other;
        }
        goto LAB_001a8e07;
      }
      pcVar14 = "rad 2";
LAB_001a8e42:
      my_strcpy(local_b8,pcVar14,0x28);
      break;
    case 0x48:
    case 0x49:
    case 0x4b:
      break;
    case 0x4a:
      wVar13 = effect->radius;
      if (effect->other != L'\0') {
        wVar13 = (int)player->lev / effect->other + wVar13;
        if ((int)(uint)z_info->max_range <= wVar13) {
          wVar13 = (wchar_t)z_info->max_range;
        }
      }
      uVar11 = (ulong)(uint)wVar13;
      pcVar14 = ", len %d";
      goto LAB_001a8e0e;
    case 0x4c:
      uVar11 = (ulong)(uint)local_c8.m_bonus;
      pcVar14 = "x%d";
LAB_001a8e0e:
      strnfmt(local_b8,0x28,pcVar14,uVar11);
      break;
    case 0x4d:
      wVar13 = effect->radius;
      if (wVar13 != L'\0') goto LAB_001a8e07;
      break;
    default:
      if (uVar1 == 0x3a) {
        if (local_c8.m_bonus != 0) {
          pcVar14 = "random";
          goto LAB_001a8e42;
        }
      }
      else if ((uVar1 == 3) && (uVar11 = (ulong)(uint)local_c8.m_bonus, local_c8.m_bonus != 0)) {
        pcVar14 = "/%d%%";
        goto LAB_001a8e0e;
      }
    }
    iVar2 = local_c8.base;
    if ((0 < local_c8.base) || ((0 < local_c8.dice && (0 < local_c8.sides)))) {
      if ((local_88 != (effect *)0x0) &&
         (((local_88->index == effect->index &&
           (iVar4 = strcmp(local_b8,(char *)&uStack_80), iVar4 == 0)) && (local_58.base == iVar2))))
      {
        if (((local_58.dice < 1 || local_58.sides < 1) &&
            ((local_c8.dice < 1 || (local_c8.sides < 1)))) ||
           ((local_58.dice == local_c8.dice && (local_58.sides == local_c8.sides))))
        goto LAB_001a902a;
      }
      if (sVar6 == 0) {
        lVar15 = 0;
      }
      else {
        sVar8 = strnfmt(p + sVar6,len - sVar6,";");
        lVar15 = sVar8 + sVar6;
      }
      sVar8 = strnfmt(p + lVar15,len - lVar15," %s ",pcVar7);
      lVar15 = sVar8 + lVar15;
      pcVar7 = p + lVar15;
      sVar8 = len - lVar15;
      if (local_c8.base < 1) {
        sVar9 = 0;
LAB_001a8f74:
      }
      else {
        sVar9 = strnfmt(pcVar7,sVar8,"%d");
        if ((0 < local_c8.dice) && (0 < local_c8.sides)) {
          sVar10 = strnfmt(pcVar7 + sVar9,sVar8 - sVar9,"+");
          sVar9 = sVar9 + sVar10;
          goto LAB_001a8f74;
        }
      }
      if (local_c8.dice == 1) {
        if (0 < local_c8.sides) {
          sVar8 = strnfmt(pcVar7 + sVar9,sVar8 - sVar9,"d%d");
LAB_001a8fc7:
          sVar9 = sVar9 + sVar8;
        }
      }
      else if ((1 < local_c8.dice) && (0 < local_c8.sides)) {
        sVar8 = strnfmt(pcVar7 + sVar9,sVar8 - sVar9,"%dd%d");
        goto LAB_001a8fc7;
      }
      sVar6 = strlen(local_b8);
      p = local_90;
      if (1 < sVar6) {
        strnfmt(local_90 + sVar9 + lVar15,len - (sVar9 + lVar15),"%s",local_b8);
      }
      local_88 = effect;
      my_strcpy((char *)&uStack_80,local_b8,0x28);
      local_58.base = local_c8.base;
      local_58.dice = local_c8.dice;
      local_58.sides = local_c8.sides;
      local_58.m_bonus = local_c8.m_bonus;
    }
LAB_001a902a:
    effect = effect->next;
  } while( true );
}

Assistant:

void get_spell_info(int spell_index, char *p, size_t len)
{
	struct effect *effect = spell_by_index(player, spell_index)->effect;
	struct spell_info_iteration_state ist = {
		NULL, "", { 0, 0, 0, 0 }, { 0, 0, 0, 0 }, false };

	p[0] = '\0';

	while (effect) {
		spell_effect_append_value_info(effect, p, len, &ist);
		effect = effect->next;
	}
}